

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partiallock.cc
# Opt level: O0

int plock_destroy(plock *plock)

{
  list_elem *plVar1;
  list_elem *plVar2;
  list *in_RDI;
  plock_node *node;
  list_elem *le;
  list_elem *local_18;
  int local_4;
  
  if (in_RDI == (list *)0x0) {
    local_4 = -1;
  }
  else {
    (*(code *)in_RDI[2].head[3].next)(in_RDI[4].head);
    local_18 = list_begin(in_RDI);
    while (local_18 != (list_elem *)0x0) {
      plVar1 = local_18 + -2;
      plVar2 = list_next(local_18);
      (*(code *)in_RDI[2].head[1].prev)(plVar1->prev);
      (*(code *)in_RDI[2].head[1].next)(plVar1->prev);
      free(local_18[-2].next);
      free(local_18[-1].prev);
      free(plVar1->prev);
      free(plVar1);
      local_18 = plVar2;
    }
    local_18 = list_begin(in_RDI + 1);
    while (local_18 != (list_elem *)0x0) {
      plVar1 = local_18 + -2;
      plVar2 = list_next(local_18);
      (*(code *)in_RDI[2].head[1].next)(plVar1->prev);
      free(local_18[-2].next);
      free(local_18[-1].prev);
      free(plVar1->prev);
      free(plVar1);
      local_18 = plVar2;
    }
    free(in_RDI[4].head);
    free(in_RDI[2].head);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int plock_destroy(struct plock *plock)
{
    struct list_elem *le;
    struct plock_node *node;

    if (!plock) {
        return PLOCK_RESULT_INVALID_ARGS;
    }

    plock->ops->destroy_internal(plock->lock);

    // free all active locks
    le = list_begin(&plock->active);
    while(le) {
        node = _get_entry(le, struct plock_node, le);
        le = list_next(le);

        // unlock and destroy
        plock->ops->unlock_user(node->lock);
        plock->ops->destroy_user(node->lock);
        free(node->start);
        free(node->len);
        free(node->lock);
        free(node);
    }

    // free all inactive locks
    le = list_begin(&plock->inactive);
    while(le) {
        node = _get_entry(le, struct plock_node, le);
        le = list_next(le);

        // destroy
        plock->ops->destroy_user(node->lock);
        free(node->start);
        free(node->len);
        free(node->lock);
        free(node);
    }

    // free plock
    free(plock->lock);
    free(plock->ops);

    return PLOCK_RESULT_SUCCESS;
}